

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::ConservativeScalMinMax
          (NavierStokesBase *this,MultiFab *Snew,int snew_comp,int new_density_comp,MultiFab *Sold,
          int sold_comp,int old_density_comp)

{
  double dVar1;
  long lVar2;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int ii;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int jj;
  long lVar17;
  long lVar18;
  int kk;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  MFIter mfi;
  long local_320;
  long local_318;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  Box local_1ec;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)Snew,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_1ec,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&Snew->super_FabArray<amrex::FArrayBox>,&local_90,snew_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&Sold->super_FabArray<amrex::FArrayBox>,&local_90,sold_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&Snew->super_FabArray<amrex::FArrayBox>,&local_90,new_density_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_190,&Sold->super_FabArray<amrex::FArrayBox>,&local_90,old_density_comp);
      lVar2 = __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (lVar2 == 0) {
        __cxa_bad_cast();
      }
      this_00 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar2 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1d0,this_00,&local_90);
      local_320 = (long)local_1ec.smallend.vect[2];
      if (local_1ec.smallend.vect[2] <= local_1ec.bigend.vect[2]) {
        lVar2 = local_320 + -1;
        lVar20 = (long)local_1ec.smallend.vect[1];
        lVar15 = local_190.jstride * 8;
        lVar16 = local_190.kstride * 8;
        lVar8 = (long)local_1ec.smallend.vect[0];
        lVar13 = local_110.jstride * 8;
        lVar14 = local_110.kstride * 8;
        lVar7 = local_1d0.jstride * 8;
        lVar12 = local_1d0.kstride * 8;
        local_2e8 = (lVar2 - local_190.begin.z) * lVar16 +
                    ((lVar20 - local_190.begin.y) + -1) * lVar15 + lVar8 * 8 +
                    (long)local_190.begin.x * -8 + (long)local_190.p;
        local_2f0 = (lVar2 - local_110.begin.z) * lVar14 +
                    ((lVar20 - local_110.begin.y) + -1) * lVar13 + lVar8 * 8 +
                    (long)local_110.begin.x * -8 + (long)local_110.p;
        local_2f8 = (lVar2 - local_1d0.begin.z) * lVar12 +
                    ((lVar20 - local_1d0.begin.y) + -1) * lVar7 + lVar8 * 8 +
                    (long)local_1d0.begin.x * -8 + (long)local_1d0.p;
        do {
          if (local_1ec.smallend.vect[1] <= local_1ec.bigend.vect[1]) {
            lVar2 = (local_320 - local_d0.begin.z) * local_d0.kstride;
            local_2c0 = local_2f8;
            local_2c8 = local_2f0;
            local_2d0 = local_2e8;
            local_318 = lVar20;
            do {
              if (local_1ec.smallend.vect[0] <= local_1ec.bigend.vect[0]) {
                lVar3 = (local_318 - local_d0.begin.y) * local_d0.jstride;
                lVar5 = local_2c0;
                lVar10 = local_2c8;
                lVar22 = local_2d0;
                lVar24 = lVar8;
                do {
                  lVar19 = -1;
                  dVar26 = 1.79769313486232e+308;
                  dVar25 = 2.2250738585072014e-308;
                  lVar4 = lVar5;
                  lVar9 = lVar10;
                  lVar21 = lVar22;
                  do {
                    lVar17 = -1;
                    lVar6 = lVar21;
                    lVar18 = lVar4;
                    lVar23 = lVar9;
                    do {
                      lVar11 = -1;
                      dVar27 = dVar25;
                      do {
                        dVar25 = dVar27;
                        if (0.0 < *(double *)(lVar18 + lVar11 * 8)) {
                          dVar25 = *(double *)(lVar23 + lVar11 * 8) /
                                   *(double *)(lVar6 + lVar11 * 8);
                          dVar1 = dVar25;
                          if (dVar26 <= dVar25) {
                            dVar1 = dVar26;
                          }
                          dVar26 = dVar1;
                          if (dVar25 <= dVar27) {
                            dVar25 = dVar27;
                          }
                        }
                        lVar11 = lVar11 + 1;
                        dVar27 = dVar25;
                      } while (lVar11 != 2);
                      lVar17 = lVar17 + 1;
                      lVar6 = lVar6 + lVar15;
                      lVar23 = lVar23 + lVar13;
                      lVar18 = lVar18 + lVar7;
                    } while (lVar17 != 2);
                    lVar19 = lVar19 + 1;
                    lVar21 = lVar21 + lVar16;
                    lVar9 = lVar9 + lVar14;
                    lVar4 = lVar4 + lVar12;
                  } while (lVar19 != 2);
                  dVar27 = local_d0.p[lVar2 + lVar3 + (lVar24 - local_d0.begin.x)] /
                           local_150.p
                           [(local_320 - local_150.begin.z) * local_150.kstride +
                            (local_318 - local_150.begin.y) * local_150.jstride +
                            (lVar24 - local_150.begin.x)];
                  if (dVar26 <= dVar27) {
                    dVar26 = dVar27;
                  }
                  if (dVar26 <= dVar25) {
                    dVar25 = dVar26;
                  }
                  local_d0.p[lVar2 + lVar3 + (lVar24 - local_d0.begin.x)] =
                       dVar25 * local_150.p
                                [(local_320 - local_150.begin.z) * local_150.kstride +
                                 (local_318 - local_150.begin.y) * local_150.jstride +
                                 (lVar24 - local_150.begin.x)];
                  lVar24 = lVar24 + 1;
                  lVar22 = lVar22 + 8;
                  lVar10 = lVar10 + 8;
                  lVar5 = lVar5 + 8;
                } while (local_1ec.bigend.vect[0] + 1 != (int)lVar24);
              }
              local_318 = local_318 + 1;
              local_2d0 = local_2d0 + lVar15;
              local_2c8 = local_2c8 + lVar13;
              local_2c0 = local_2c0 + lVar7;
            } while (local_1ec.bigend.vect[1] + 1 != (int)local_318);
          }
          local_320 = local_320 + 1;
          local_2e8 = local_2e8 + lVar16;
          local_2f0 = local_2f0 + lVar14;
          local_2f8 = local_2f8 + lVar12;
        } while (local_1ec.bigend.vect[2] + 1 != (int)local_320);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
NavierStokesBase::ConservativeScalMinMax ( amrex::MultiFab&       Snew, const int snew_comp, const int new_density_comp,
                                           amrex::MultiFab const& Sold, const int sold_comp, const int old_density_comp )
{

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const auto& bx = mfi.tilebox();

        const auto& sn   = Snew.array(mfi,snew_comp);
        const auto& so   = Sold.const_array(mfi,sold_comp);
        const auto& rhon = Snew.const_array(mfi,new_density_comp);
        const auto& rhoo = Sold.const_array(mfi,old_density_comp);
#ifdef AMREX_USE_EB
        const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
        const auto& vfrac = ebfactory.getVolFrac().const_array(mfi);
#endif

        amrex::ParallelFor(bx, [=]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real smn = std::numeric_limits<Real>::max();
            Real smx = std::numeric_limits<Real>::min();

#if (AMREX_SPACEDIM==3)
            int ks = -1;
            int ke =  1;
#else
            int ks = 0;
            int ke = 0;
#endif

            for (int kk = ks; kk <= ke; ++kk)
            {
                for (int jj = -1; jj <= 1; ++jj)
                {
                    for (int ii = -1; ii <= 1; ++ii)
                    {
#ifdef AMREX_USE_EB
                        if ( vfrac (i+ii,j+jj,k+kk) > 0. )
#endif
                        {
                            smn =  amrex::min(smn, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                            smx =  amrex::max(smx, so(i+ii,j+jj,k+kk)/rhoo(i+ii,j+jj,k+kk));
                        }
                    }
                }
            }
            sn(i,j,k) = amrex::min( amrex::max(sn(i,j,k)/rhon(i,j,k), smn), smx ) * rhon(i,j,k);
        });
    }
}